

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall
ON_RevSurface::IsCylindrical(ON_RevSurface *this,ON_Cylinder *cylinder,double tolerance)

{
  bool bVar1;
  double dVar2;
  double local_160;
  ON_3dVector local_140;
  undefined4 local_124;
  double local_120;
  double h;
  double r [2];
  undefined1 local_f0 [8];
  ON_Line line;
  ON_Cylinder c;
  double tolerance_local;
  ON_Cylinder *cylinder_local;
  ON_RevSurface *this_local;
  
  c.height[1] = tolerance;
  ON_Cylinder::ON_Cylinder((ON_Cylinder *)&line.to.z);
  ON_Line::ON_Line((ON_Line *)local_f0);
  h = 0.0;
  r[0] = 0.0;
  local_120 = 0.0;
  bVar1 = ON_IsValid(c.height[1]);
  if ((!bVar1) || (c.height[1] <= 0.0)) {
    c.height[1] = 2.3283064365386963e-10;
  }
  bVar1 = ON__IsCylConeHelper(&this->m_axis,this->m_curve,c.height[1],(ON_Plane *)&line.to.z,
                              (ON_Line *)local_f0,&h,&local_120);
  if (bVar1) {
    if (ABS(h - r[0]) <= c.height[1]) {
      ON_Line::Tangent(&local_140,(ON_Line *)local_f0);
      dVar2 = ON_3dVector::operator*(&local_140,(ON_3dVector *)&c.circle.plane.origin.z);
      if (ABS(dVar2) <= 2.3283064365386963e-10) {
        if ((h != r[0]) || (NAN(h) || NAN(r[0]))) {
          local_160 = (h + r[0]) * 0.5;
        }
        else {
          local_160 = h;
        }
        c.circle.plane.plane_equation.d = local_160;
        c.circle.radius = 0.0;
        c.height[0] = local_120;
        if (cylinder != (ON_Cylinder *)0x0) {
          memcpy(cylinder,&line.to.z,0x98);
        }
        this_local._7_1_ = ON_Cylinder::IsValid((ON_Cylinder *)&line.to.z);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  local_124 = 1;
  ON_Line::~ON_Line((ON_Line *)local_f0);
  ON_Cylinder::~ON_Cylinder((ON_Cylinder *)&line.to.z);
  return this_local._7_1_;
}

Assistant:

bool ON_RevSurface::IsCylindrical(
      ON_Cylinder* cylinder,
      double tolerance
      ) const
{
  ON_Cylinder c;
  ON_Line line;
  double r[2] = {0.0,0.0};
  double h = 0.0;
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;
  if ( !ON__IsCylConeHelper(m_axis,m_curve,tolerance,c.circle.plane,line,r,h) )
    return false;
  if ( fabs(r[0]-r[1]) > tolerance )
    return false;
  if ( fabs(line.Tangent()*c.circle.plane.xaxis) > ON_ZERO_TOLERANCE )
    return false;
  c.circle.radius = (r[0]==r[1]) ? r[0] : (0.5*(r[0]+r[1]));
  c.height[0] = 0.0;
  c.height[1] = h;
  if ( cylinder )
    *cylinder = c;
  return c.IsValid();
}